

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

cupdlp_bool PDHG_Check_Termination_Average(CUPDLPwork *pdhg,int bool_print)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int in_ESI;
  long in_RDI;
  int bool_pass;
  CUPDLPscaling *scaling;
  CUPDLPresobj *resobj;
  CUPDLPsettings *settings;
  CUPDLPproblem *problem;
  
  lVar1 = *(long *)(in_RDI + 8);
  lVar2 = *(long *)(in_RDI + 0x10);
  lVar3 = *(long *)(in_RDI + 0x28);
  if (in_ESI != 0) {
    printf("Termination check: %e|%e  %e|%e  %e|%e\n",*(undefined8 *)(lVar2 + 0x128),
           *(double *)(lVar1 + 0x10) * (*(double *)(lVar3 + 0x40) + 1.0),
           *(undefined8 *)(lVar2 + 0x130),
           *(double *)(lVar1 + 0x18) * (*(double *)(lVar3 + 0x38) + 1.0),
           *(undefined8 *)(lVar2 + 0x138),*(undefined8 *)(lVar1 + 0x20));
  }
  bVar4 = false;
  if ((*(double *)(lVar2 + 0x128) < *(double *)(lVar1 + 0x10) * (*(double *)(lVar3 + 0x40) + 1.0))
     && (bVar4 = false,
        *(double *)(lVar2 + 0x130) < *(double *)(lVar1 + 0x18) * (*(double *)(lVar3 + 0x38) + 1.0)))
  {
    bVar4 = *(double *)(lVar2 + 0x138) < *(double *)(lVar1 + 0x20);
  }
  return bVar4;
}

Assistant:

cupdlp_bool PDHG_Check_Termination_Average(CUPDLPwork *pdhg, int bool_print) {
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPsettings *settings = pdhg->settings;
  CUPDLPresobj *resobj = pdhg->resobj;
  CUPDLPscaling *scaling = pdhg->scaling;
#if PDHG_DISPLAY_TERMINATION_CHECK
  if (bool_print) {
    cupdlp_printf("Termination check: %e|%e  %e|%e  %e|%e\n",
                  resobj->dPrimalFeasAverage,
                  settings->dPrimalTol * (1.0 + scaling->dNormRhs),
                  resobj->dDualFeasAverage,
                  settings->dDualTol * (1.0 + scaling->dNormCost),
                  resobj->dRelObjGapAverage, settings->dGapTol);
  }
#endif
  int bool_pass = ((resobj->dPrimalFeasAverage <
                    settings->dPrimalTol * (1.0 + scaling->dNormRhs)) &&
                   (resobj->dDualFeasAverage <
                    settings->dDualTol * (1.0 + scaling->dNormCost)) &&
                   (resobj->dRelObjGapAverage < settings->dGapTol));
  return bool_pass;
}